

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_dn_gets(char *buf,size_t size,mbedtls_x509_name *dn)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  uchar uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  size_t __maxlen;
  mbedtls_asn1_named_data *oid;
  char *pcVar14;
  bool bVar15;
  byte local_178 [8];
  char s [256];
  uchar *local_70;
  uchar *asn1_len_p;
  ulong local_60;
  mbedtls_x509_name *local_58;
  char *local_50;
  char *short_name;
  uchar local_3e [6];
  char *pcStack_38;
  uchar asn1_tag_len_buf [6];
  
  local_50 = (char *)0x0;
  memset(local_178,0,0x100);
  uVar4 = '\0';
  __maxlen = size;
  oid = dn;
  while( true ) {
    while( true ) {
      pcVar10 = " + ";
      if (oid == (mbedtls_x509_name *)0x0) {
        return (int)size - (int)__maxlen;
      }
      if ((oid->oid).p != (uchar *)0x0) break;
      oid = oid->next;
    }
    if (oid != dn) {
      if (uVar4 == '\0') {
        pcVar10 = ", ";
      }
      uVar5 = snprintf(buf,__maxlen,pcVar10);
      if ((int)uVar5 < 0) {
        return -0x2980;
      }
      uVar12 = (ulong)uVar5;
      bVar15 = __maxlen < uVar12;
      __maxlen = __maxlen - uVar12;
      if (bVar15 || __maxlen == 0) {
        return -0x2980;
      }
      buf = buf + uVar12;
    }
    iVar6 = (oid->val).tag;
    bVar15 = false;
    if ((iVar6 != 0xc) && (iVar6 != 0x13)) {
      bVar15 = iVar6 != 0x16;
    }
    pcStack_38 = buf;
    iVar6 = mbedtls_oid_get_attr_short_name(&oid->oid,&local_50);
    pcVar10 = pcStack_38;
    asn1_len_p = (uchar *)size;
    if (iVar6 == 0) {
      uVar5 = snprintf(pcStack_38,__maxlen,"%s=",local_50);
    }
    else {
      uVar5 = mbedtls_oid_get_numeric_string(pcStack_38,__maxlen,&oid->oid);
      if ((int)uVar5 < 1) {
        if (uVar5 == 0xfffffff5) {
          return -0x2980;
        }
        uVar5 = snprintf(pcStack_38,__maxlen,"??=");
      }
      else {
        __maxlen = __maxlen - uVar5;
        pcStack_38 = pcVar10 + uVar5;
        uVar5 = snprintf(pcStack_38,__maxlen,"=");
        bVar15 = true;
      }
    }
    if ((int)uVar5 < 0) {
      return -0x2980;
    }
    local_60 = (ulong)uVar5;
    short_name = (char *)(__maxlen - local_60);
    if (__maxlen < local_60 || short_name == (char *)0x0) {
      return -0x2980;
    }
    local_58 = dn;
    if (bVar15) {
      local_178[0] = 0x23;
      local_70 = (uchar *)&stack0xffffffffffffffc8;
      iVar6 = mbedtls_asn1_write_len(&local_70,local_3e,(oid->val).len);
      if ((iVar6 < 0) ||
         (iVar7 = mbedtls_asn1_write_tag(&local_70,local_3e,(uchar)(oid->val).tag),
         pcVar14 = pcStack_38, pcVar10 = short_name, iVar7 < 0)) {
        return -0x6e;
      }
      uVar12 = 1;
      for (uVar11 = 0; cVar3 = '7', (uint)(iVar7 + iVar6) != uVar11; uVar11 = uVar11 + 1) {
        if (uVar11 == 0x7f) {
          return -0x2980;
        }
        bVar13 = *(byte *)((long)&stack0xffffffffffffffc8 + (uVar11 - (uint)(iVar7 + iVar6)));
        cVar2 = '0';
        if (0x9f < bVar13) {
          cVar2 = cVar3;
        }
        local_178[uVar12] = cVar2 + (bVar13 >> 4);
        cVar2 = '0';
        if (9 < (bVar13 & 0xf)) {
          cVar2 = cVar3;
        }
        local_178[uVar12 + 1] = cVar2 + (bVar13 & 0xf);
        uVar12 = uVar12 + 2;
      }
      for (uVar11 = 0; uVar11 < (oid->val).len; uVar11 = uVar11 + 1) {
        if (0xfd < uVar12) {
          return -0x2980;
        }
        bVar13 = (oid->val).p[uVar11];
        cVar2 = '0';
        if (0x9f < bVar13) {
          cVar2 = cVar3;
        }
        local_178[uVar12] = cVar2 + (bVar13 >> 4);
        cVar2 = '0';
        if (9 < (bVar13 & 0xf)) {
          cVar2 = cVar3;
        }
        local_178[uVar12 + 1] = cVar2 + (bVar13 & 0xf);
        uVar12 = uVar12 + 2;
      }
    }
    else {
      uVar12 = 0;
      for (uVar11 = 0; uVar1 = (oid->val).len, pcVar10 = short_name, pcVar14 = pcStack_38,
          uVar11 < uVar1; uVar11 = uVar11 + 1) {
        if (0xfe < uVar12) {
          return -0x2980;
        }
        bVar13 = (oid->val).p[uVar11];
        if (bVar13 == 0) {
          return -0x2380;
        }
        pvVar8 = memchr(",=+<>;\"\\",(uint)bVar13,9);
        if ((pvVar8 != (void *)0x0) ||
           (((uVar11 == 0 && ((bVar13 == 0x20 || (bVar13 == 0x23)))) ||
            (bVar13 == 0x20 && uVar11 == uVar1 - 1)))) {
          if (uVar12 == 0xfe) {
            return -0x2980;
          }
          local_178[uVar12] = 0x5c;
          uVar12 = uVar12 + 1;
        }
        if ((byte)(bVar13 + 0x81) < 0xa1) {
          if (uVar12 - 0xfc < 0xffffffffffffff01) {
            return -0x2980;
          }
          local_178[uVar12] = 0x5c;
          cVar3 = '7';
          if (bVar13 < 0xa0) {
            cVar3 = '0';
          }
          local_178[uVar12 + 1] = cVar3 + (bVar13 >> 4);
          uVar12 = uVar12 + 2;
          cVar3 = '7';
          if ((bVar13 & 0xf) < 10) {
            cVar3 = '0';
          }
          bVar13 = cVar3 + (bVar13 & 0xf);
        }
        local_178[uVar12] = bVar13;
        uVar12 = uVar12 + 1;
      }
    }
    pcVar14 = pcVar14 + local_60;
    local_178[uVar12] = 0;
    uVar5 = snprintf(pcVar14,(size_t)pcVar10,"%s",local_178);
    if ((int)uVar5 < 0) {
      return -0x2980;
    }
    pcVar9 = (char *)(ulong)uVar5;
    __maxlen = (long)pcVar10 - (long)pcVar9;
    if (pcVar10 < pcVar9 || __maxlen == 0) break;
    buf = pcVar14 + (long)pcVar9;
    uVar4 = oid->next_merged;
    oid = oid->next;
    size = (size_t)asn1_len_p;
    dn = local_58;
  }
  return -0x2980;
}

Assistant:

int mbedtls_x509_dn_gets(char *buf, size_t size, const mbedtls_x509_name *dn)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, n, asn1_len_size, asn1_tag_size, asn1_tag_len_buf_start;
    /* 6 is enough as our asn1 write functions only write one byte for the tag and at most five bytes for the length*/
    unsigned char asn1_tag_len_buf[6];
    unsigned char *asn1_len_p;
    unsigned char c, merge = 0;
    const mbedtls_x509_name *name;
    const char *short_name = NULL;
    char lowbits, highbits;
    char s[MBEDTLS_X509_MAX_DN_NAME_SIZE], *p;
    int print_hexstring;

    memset(s, 0, sizeof(s));

    name = dn;
    p = buf;
    n = size;

    while (name != NULL) {
        if (!name->oid.p) {
            name = name->next;
            continue;
        }

        if (name != dn) {
            ret = mbedtls_snprintf(p, n, merge ? " + " : ", ");
            MBEDTLS_X509_SAFE_SNPRINTF;
        }

        print_hexstring = (name->val.tag != MBEDTLS_ASN1_UTF8_STRING) &&
                          (name->val.tag != MBEDTLS_ASN1_PRINTABLE_STRING) &&
                          (name->val.tag != MBEDTLS_ASN1_IA5_STRING);

        if ((ret = mbedtls_oid_get_attr_short_name(&name->oid, &short_name)) == 0) {
            ret = mbedtls_snprintf(p, n, "%s=", short_name);
        } else {
            if ((ret = mbedtls_oid_get_numeric_string(p, n, &name->oid)) > 0) {
                n -= ret;
                p += ret;
                ret = mbedtls_snprintf(p, n, "=");
                print_hexstring = 1;
            } else if (ret == MBEDTLS_ERR_OID_BUF_TOO_SMALL) {
                return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
            } else {
                ret = mbedtls_snprintf(p, n, "\?\?=");
            }
        }
        MBEDTLS_X509_SAFE_SNPRINTF;

        if (print_hexstring) {
            s[0] = '#';

            asn1_len_p = asn1_tag_len_buf + sizeof(asn1_tag_len_buf);
            if ((ret = mbedtls_asn1_write_len(&asn1_len_p, asn1_tag_len_buf, name->val.len)) < 0) {
                return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            }
            asn1_len_size = ret;
            if ((ret = mbedtls_asn1_write_tag(&asn1_len_p, asn1_tag_len_buf, name->val.tag)) < 0) {
                return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            }
            asn1_tag_size = ret;
            asn1_tag_len_buf_start = sizeof(asn1_tag_len_buf) - asn1_len_size - asn1_tag_size;
            for (i = 0, j = 1; i < asn1_len_size + asn1_tag_size; i++) {
                if (j + 1 >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }
                c = asn1_tag_len_buf[asn1_tag_len_buf_start+i];
                lowbits = (c & 0x0F);
                highbits = c >> 4;
                s[j++] = nibble_to_hex_digit(highbits);
                s[j++] = nibble_to_hex_digit(lowbits);
            }
            for (i = 0; i < name->val.len; i++) {
                if (j + 1 >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }
                c = name->val.p[i];
                lowbits = (c & 0x0F);
                highbits = c >> 4;
                s[j++] = nibble_to_hex_digit(highbits);
                s[j++] = nibble_to_hex_digit(lowbits);
            }
        } else {
            for (i = 0, j = 0; i < name->val.len; i++, j++) {
                if (j >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                c = name->val.p[i];
                // Special characters requiring escaping, RFC 4514 Section 2.4
                if (c == '\0') {
                    return MBEDTLS_ERR_X509_INVALID_NAME;
                } else {
                    if (strchr(",=+<>;\"\\", c) ||
                        ((i == 0) && strchr("# ", c)) ||
                        ((i == name->val.len-1) && (c == ' '))) {
                        if (j + 1 >= sizeof(s) - 1) {
                            return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                        }
                        s[j++] = '\\';
                    }
                }
                if (c < 32 || c >= 127) {
                    if (j + 3 >= sizeof(s) - 1) {
                        return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                    }
                    s[j++] = '\\';
                    lowbits = (c & 0x0F);
                    highbits = c >> 4;
                    s[j++] = nibble_to_hex_digit(highbits);
                    s[j] = nibble_to_hex_digit(lowbits);
                } else {
                    s[j] = c;
                }
            }
        }
        s[j] = '\0';
        ret = mbedtls_snprintf(p, n, "%s", s);
        MBEDTLS_X509_SAFE_SNPRINTF;

        merge = name->next_merged;
        name = name->next;
    }

    return (int) (size - n);
}